

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Preprocessor.cpp
# Opt level: O0

void __thiscall slang::parsing::Preprocessor::Preprocessor(Preprocessor *this,Preprocessor *other)

{
  undefined8 *in_RSI;
  undefined8 *in_RDI;
  undefined4 in_stack_ffffffffffffff68;
  LanguageVersion in_stack_ffffffffffffff6c;
  LexerOptions *in_stack_ffffffffffffff70;
  vector<slang::parsing::KeywordVersion,_std::allocator<slang::parsing::KeywordVersion>_> *this_00;
  undefined7 in_stack_ffffffffffffff78;
  undefined1 in_stack_ffffffffffffff7f;
  NumberParser *in_stack_ffffffffffffff80;
  unordered_flat_map<std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::Preprocessor::MacroDef,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::Preprocessor::MacroDef>_>_>
  *in_stack_ffffffffffffff90;
  unordered_flat_map<std::basic_string_view<char,_std::char_traits<char>_>,_void_(slang::parsing::Preprocessor::*)(slang::parsing::Token,_const_slang::syntax::PragmaExpressionSyntax_*,_slang::SmallVectorBase<slang::parsing::Token>_&),_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_void_(slang::parsing::Preprocessor::*)(slang::parsing::Token,_const_slang::syntax::PragmaExpressionSyntax_*,_slang::SmallVectorBase<slang::parsing::Token>_&)>_>_>
  *this_01;
  PreprocessorOptions *in_stack_ffffffffffffff98;
  PreprocessorOptions *in_stack_ffffffffffffffa0;
  
  *in_RDI = *in_RSI;
  in_RDI[1] = in_RSI[1];
  in_RDI[2] = in_RSI[2];
  PreprocessorOptions::PreprocessorOptions(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
  LexerOptions::LexerOptions
            (in_stack_ffffffffffffff70,
             (LexerOptions *)CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68));
  SmallVector<std::unique_ptr<slang::parsing::Lexer,_std::default_delete<slang::parsing::Lexer>_>,_2UL>
  ::SmallVector((SmallVector<std::unique_ptr<slang::parsing::Lexer,_std::default_delete<slang::parsing::Lexer>_>,_2UL>
                 *)0x2b5629);
  SmallVector<slang::parsing::Preprocessor::BranchEntry,_2UL>::SmallVector
            ((SmallVector<slang::parsing::Preprocessor::BranchEntry,_2UL> *)0x2b563f);
  boost::unordered::
  unordered_flat_map<std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::Preprocessor::MacroDef,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::Preprocessor::MacroDef>_>_>
  ::unordered_flat_map(in_stack_ffffffffffffff90);
  SmallVector<slang::parsing::Token,_2UL>::SmallVector
            ((SmallVector<slang::parsing::Token,_2UL> *)0x2b566d);
  in_RDI[0x3a] = 0;
  Token::Token((Token *)in_stack_ffffffffffffff70);
  Token::Token((Token *)in_stack_ffffffffffffff70);
  *(undefined1 *)(in_RDI + 0x3f) = 0;
  *(undefined1 *)((long)in_RDI + 0x1f9) = 0;
  SmallVector<slang::parsing::Token,_2UL>::SmallVector
            ((SmallVector<slang::parsing::Token,_2UL> *)0x2b56c2);
  boost::unordered::
  unordered_flat_set<const_char_*,_slang::hash<const_char_*,_void>,_std::equal_to<const_char_*>,_std::allocator<const_char_*>_>
  ::unordered_flat_set
            ((unordered_flat_set<const_char_*,_slang::hash<const_char_*,_void>,_std::equal_to<const_char_*>,_std::allocator<const_char_*>_>
              *)in_stack_ffffffffffffff90);
  std::vector<slang::parsing::KeywordVersion,_std::allocator<slang::parsing::KeywordVersion>_>::
  vector((vector<slang::parsing::KeywordVersion,_std::allocator<slang::parsing::KeywordVersion>_> *)
         0x2b56f0);
  std::optional<slang::TimeScale>::optional((optional<slang::TimeScale> *)0x2b5701);
  *(undefined2 *)((long)in_RDI + 0x286) = 0x14f;
  *(undefined2 *)(in_RDI + 0x51) = 0;
  *(undefined1 *)((long)in_RDI + 0x28a) = 0;
  *(undefined4 *)((long)in_RDI + 0x28c) = 0;
  *(undefined4 *)(in_RDI + 0x52) = 0;
  *(undefined4 *)((long)in_RDI + 0x294) = 0;
  *(undefined4 *)(in_RDI + 0x53) = 0;
  *(undefined4 *)((long)in_RDI + 0x29c) = 0;
  *(undefined4 *)(in_RDI + 0x54) = 0;
  *(undefined4 *)((long)in_RDI + 0x2a4) = 3;
  this_01 = (unordered_flat_map<std::basic_string_view<char,_std::char_traits<char>_>,_void_(slang::parsing::Preprocessor::*)(slang::parsing::Token,_const_slang::syntax::PragmaExpressionSyntax_*,_slang::SmallVectorBase<slang::parsing::Token>_&),_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_void_(slang::parsing::Preprocessor::*)(slang::parsing::Token,_const_slang::syntax::PragmaExpressionSyntax_*,_slang::SmallVectorBase<slang::parsing::Token>_&)>_>_>
             *)(in_RDI + 0x55);
  NumberParser::NumberParser
            (in_stack_ffffffffffffff80,
             (Diagnostics *)CONCAT17(in_stack_ffffffffffffff7f,in_stack_ffffffffffffff78),
             (BumpAllocator *)in_stack_ffffffffffffff70,in_stack_ffffffffffffff6c);
  boost::unordered::
  unordered_flat_map<std::basic_string_view<char,_std::char_traits<char>_>,_void_(slang::parsing::Preprocessor::*)(slang::parsing::Token,_const_slang::syntax::PragmaExpressionSyntax_*,_slang::SmallVectorBase<slang::parsing::Token>_&),_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_void_(slang::parsing::Preprocessor::*)(slang::parsing::Token,_const_slang::syntax::PragmaExpressionSyntax_*,_slang::SmallVectorBase<slang::parsing::Token>_&)>_>_>
  ::unordered_flat_map(this_01);
  this_00 = (vector<slang::parsing::KeywordVersion,_std::allocator<slang::parsing::KeywordVersion>_>
             *)(in_RDI + 0x4d);
  LexerFacts::getDefaultKeywordVersion(*(LanguageVersion *)((long)in_RDI + 0x1c));
  std::vector<slang::parsing::KeywordVersion,_std::allocator<slang::parsing::KeywordVersion>_>::
  push_back(this_00,(value_type *)CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68));
  return;
}

Assistant:

Preprocessor::Preprocessor(const Preprocessor& other) :
    sourceManager(other.sourceManager), alloc(other.alloc), diagnostics(other.diagnostics),
    options(other.options), lexerOptions(other.lexerOptions),
    numberParser(diagnostics, alloc, options.languageVersion) {

    keywordVersionStack.push_back(LF::getDefaultKeywordVersion(options.languageVersion));
}